

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O2

void __thiscall
RigidBodyDynamics::Model::SetQuaternion(Model *this,uint i,Quaternion *quat,VectorNd *Q)

{
  uint uVar1;
  double *pdVar2;
  
  uVar1 = (this->mJoints).
          super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          .
          super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ._M_impl.super__Vector_impl_data._M_start[i].q_index;
  pdVar2 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar2[uVar1] =
       (quat->super_Vector4d).super_Vector4d.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
  pdVar2[uVar1 + 1] =
       (quat->super_Vector4d).super_Vector4d.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
  pdVar2[uVar1 + 2] =
       (quat->super_Vector4d).super_Vector4d.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
  pdVar2[(this->multdof3_w_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start[i]] =
       (quat->super_Vector4d).super_Vector4d.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
  return;
}

Assistant:

void SetQuaternion (unsigned int i,
                      const Math::Quaternion &quat,
                      Math::VectorNd &Q) const
  {
    assert (mJoints[i].mJointType == JointTypeSpherical);
    unsigned int q_index = mJoints[i].q_index;

    Q[q_index] = quat[0];
    Q[q_index + 1] = quat[1];
    Q[q_index + 2] = quat[2];
    Q[multdof3_w_index[i]] = quat[3];
  }